

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceMatrix4x4.cpp
# Opt level: O2

Matrix4x4 * __thiscall IceMaths::Matrix4x4::Invert(Matrix4x4 *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  fVar1 = Determinant(this);
  if (1e-07 <= ABS(fVar1)) {
    fVar1 = 1.0 / fVar1;
    fVar2 = CoFactor(this,0,0);
    fVar3 = CoFactor(this,0,1);
    fVar4 = CoFactor(this,0,2);
    fVar5 = CoFactor(this,0,3);
    fVar6 = CoFactor(this,1,0);
    fVar7 = CoFactor(this,1,1);
    fVar8 = CoFactor(this,1,2);
    fVar9 = CoFactor(this,1,3);
    fVar10 = CoFactor(this,2,0);
    fVar11 = CoFactor(this,2,1);
    fVar12 = CoFactor(this,2,2);
    fVar13 = CoFactor(this,2,3);
    fVar14 = CoFactor(this,3,0);
    fVar15 = CoFactor(this,3,1);
    fVar16 = CoFactor(this,3,2);
    fVar17 = CoFactor(this,3,3);
    this->m[0][0] = fVar2 * fVar1;
    this->m[0][1] = fVar6 * fVar1;
    this->m[0][2] = fVar10 * fVar1;
    this->m[0][3] = fVar14 * fVar1;
    this->m[1][0] = fVar3 * fVar1;
    this->m[1][1] = fVar7 * fVar1;
    this->m[1][2] = fVar11 * fVar1;
    this->m[1][3] = fVar15 * fVar1;
    this->m[2][0] = fVar4 * fVar1;
    this->m[2][1] = fVar8 * fVar1;
    this->m[2][2] = fVar12 * fVar1;
    this->m[2][3] = fVar16 * fVar1;
    this->m[3][0] = fVar5 * fVar1;
    this->m[3][1] = fVar9 * fVar1;
    this->m[3][2] = fVar13 * fVar1;
    this->m[3][3] = fVar17 * fVar1;
  }
  return this;
}

Assistant:

Matrix4x4& Matrix4x4::Invert()
{
	float Det = Determinant();
	Matrix4x4 Temp;

	if(fabsf(Det) < MATRIX4X4_EPSILON)
		return	*this;		// The matrix is not invertible! Singular case!

	float IDet = 1.0f / Det;

	Temp.m[0][0] = CoFactor(0,0) * IDet;
	Temp.m[1][0] = CoFactor(0,1) * IDet;
	Temp.m[2][0] = CoFactor(0,2) * IDet;
	Temp.m[3][0] = CoFactor(0,3) * IDet;
	Temp.m[0][1] = CoFactor(1,0) * IDet;
	Temp.m[1][1] = CoFactor(1,1) * IDet;
	Temp.m[2][1] = CoFactor(1,2) * IDet;
	Temp.m[3][1] = CoFactor(1,3) * IDet;
	Temp.m[0][2] = CoFactor(2,0) * IDet;
	Temp.m[1][2] = CoFactor(2,1) * IDet;
	Temp.m[2][2] = CoFactor(2,2) * IDet;
	Temp.m[3][2] = CoFactor(2,3) * IDet;
	Temp.m[0][3] = CoFactor(3,0) * IDet;
	Temp.m[1][3] = CoFactor(3,1) * IDet;
	Temp.m[2][3] = CoFactor(3,2) * IDet;
	Temp.m[3][3] = CoFactor(3,3) * IDet;

	*this = Temp;

	return	*this;
}